

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_nameFilterWorks_TestShell::~TEST_TestRegistry_nameFilterWorks_TestShell
          (TEST_TestRegistry_nameFilterWorks_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestRegistry, nameFilterWorks)
{
    test1->setTestName("testname");
    test2->setTestName("noname");
    TestFilter nameFilter("testname");
    myRegistry->setNameFilters(&nameFilter);
    addAndRunAllTests();
    CHECK(test1->hasRun_);
    CHECK(!test2->hasRun_);
}